

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
dependent_schemas_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
::do_validate(dependent_schemas_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              *this)

{
  error_reporter *in_stack_000000f0;
  evaluation_results *in_stack_000000f8;
  json_pointer *in_stack_00000100;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000108;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000110;
  dependent_schemas_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000118;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000130;
  
  dependent_schemas_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::do_validate(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
                in_stack_000000f8,in_stack_000000f0,in_stack_00000130);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            if (!instance.is_object())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            for (const auto& dep : dependent_schemas_) 
            {
                auto prop = instance.find(dep.first);
                if (prop != instance.object_range().end()) 
                {
                    // if dependency-prop is present in instance
                    jsonpointer::json_pointer prop_location = instance_location / dep.first;
                    walk_result result = dep.second->validate(this_context, instance, prop_location, results, reporter, patch); // validate
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            return walk_result::advance;
        }